

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_mels.c
# Opt level: O3

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = *user_data;
  dVar2 = **(double **)((long)y->content + 0x10);
  dVar3 = atan(t);
  **(double **)((long)ydot->content + 0x10) = (dVar2 * dVar1 + 1.0 / (t * t + 1.0)) - dVar3 * dVar1;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype lambda = rdata[0]; /* set shortcut for stiffness parameter */
  sunrealtype u      = NV_Ith_S(y, 0); /* access current solution value */

  /* fill in the RHS function: "NV_Ith_S" accesses the 0th entry of ydot */
  NV_Ith_S(ydot, 0) = lambda * u + SUN_RCONST(1.0) / (SUN_RCONST(1.0) + t * t) -
                      lambda * atan(t);

  return 0; /* return with success */
}